

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::UpdateWindowManualResize
               (ImGuiWindow *window,ImVec2 *size_auto_fit,int *border_held,int resize_grip_count,
               ImU32 *resize_grip_col,ImRect *visibility_rect)

{
  ImVec2 IVar1;
  ImVec2 mx;
  ImU32 IVar2;
  float in_ECX;
  ImGuiMouseCursor IVar3;
  uint *in_RDX;
  ImGuiWindow *in_RDI;
  ImU32 *in_R8;
  float *in_R9;
  float fVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar28 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar30 [56];
  undefined1 auVar29 [64];
  ImRect IVar31;
  float NAV_RESIZE_SPEED;
  ImVec2 nav_resize_delta;
  ImVec2 clamp_max_1;
  ImVec2 clamp_min_1;
  ImVec2 border_posn;
  ImVec2 border_target;
  ImRect border_rect;
  bool held_1;
  bool hovered_1;
  int border_n;
  ImVec2 clamp_max;
  ImVec2 clamp_min;
  ImVec2 corner_target;
  bool held;
  bool hovered;
  ImRect resize_rect;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  int resize_grip_n;
  ImVec2 size_target;
  ImVec2 pos_target;
  float grip_hover_outer_size;
  float grip_hover_inner_size;
  float grip_draw_size;
  int resize_border_count;
  bool ret_auto_fit;
  ImGuiWindowFlags flags;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  ImVec2 *in_stack_fffffffffffffdd8;
  ImVec2 *lhs;
  ImVec2 *in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdec;
  float in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  float fVar32;
  undefined4 in_stack_fffffffffffffdfc;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  float in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe14;
  float in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe1c;
  ImVec2 *in_stack_fffffffffffffe20;
  ImGuiWindow *in_stack_fffffffffffffe28;
  float local_1c8;
  ImVec2 local_180;
  ImVec2 local_178;
  undefined8 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  undefined8 local_128;
  undefined8 local_120;
  byte local_116;
  byte local_115;
  uint local_114;
  ImVec2 local_110;
  undefined8 local_104;
  ImVec2 local_fc;
  ImVec2 local_f4;
  undefined8 local_ec;
  undefined8 local_e4;
  undefined8 local_dc;
  undefined8 local_d4;
  undefined8 local_cc;
  ImVec2 local_c4;
  byte local_ba;
  byte local_b9;
  undefined8 local_b8;
  ImVec2 local_b0;
  undefined8 local_a8;
  ImVec2 local_a0;
  ImRect local_98;
  undefined8 local_88;
  undefined1 local_80 [20];
  float local_6c;
  ImVec2 local_68;
  ImVec2 local_60;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  byte local_45;
  float local_44;
  ImVec2 local_40;
  float *local_38;
  ImU32 *local_30;
  float local_24;
  uint *local_20;
  ImGuiWindow *local_10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  
  local_40 = (ImVec2)GImGui;
  local_44 = (float)in_RDI->Flags;
  if ((((((uint)local_44 & 2) != 0) || (((uint)local_44 & 0x40) != 0)) ||
      ('\0' < in_RDI->AutoFitFramesX)) || ('\0' < in_RDI->AutoFitFramesY)) {
    return false;
  }
  if ((in_RDI->WasActive & 1U) == 0) {
    return false;
  }
  local_45 = 0;
  local_4c = 0.0;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) != 0) {
    local_4c = 5.60519e-45;
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  fVar4 = ImMax<float>(GImGui->FontSize * 1.35,GImGui->FontSize * 0.2 + in_RDI->WindowRounding + 1.0
                      );
  local_50 = (float)(int)fVar4;
  local_54 = (float)(int)(local_50 * 0.75);
  local_1c8 = 4.0;
  if ((*(bool *)((long)local_40 + 0xcc) & 1U) == 0) {
    local_1c8 = 0.0;
  }
  local_58 = local_1c8;
  ImVec2::ImVec2(&local_60,3.4028235e+38,3.4028235e+38);
  ImVec2::ImVec2(&local_68,3.4028235e+38,3.4028235e+38);
  (local_10->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
  PushID((char *)in_stack_fffffffffffffde0);
  for (local_6c = 0.0; (int)local_6c < (int)local_24; local_6c = (float)((int)local_6c + 1)) {
    local_80._8_8_ = resize_grip_def + (int)local_6c;
    in_stack_fffffffffffffe20 = &local_10->Pos;
    auVar5._0_8_ = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                               (ImVec2 *)0x1c4541);
    auVar5._8_56_ = extraout_var;
    local_88 = vmovlpd_avx(auVar5._0_16_);
    auVar6._0_8_ = ImLerp(in_stack_fffffffffffffdd8,
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          (ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    auVar6._8_56_ = extraout_var_00;
    local_80._0_8_ = vmovlpd_avx(auVar6._0_16_);
    auVar7._0_8_ = ::operator*((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0.0);
    auVar7._8_56_ = extraout_var_01;
    local_a8 = vmovlpd_avx(auVar7._0_16_);
    in_stack_fffffffffffffe28 = (ImGuiWindow *)local_80;
    auVar8._0_8_ = ::operator-((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                               (ImVec2 *)0x1c45aa);
    auVar8._8_56_ = extraout_var_02;
    local_a0 = (ImVec2)vmovlpd_avx(auVar8._0_16_);
    auVar9._0_8_ = ::operator*((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0.0);
    auVar9._8_56_ = extraout_var_03;
    local_b8 = vmovlpd_avx(auVar9._0_16_);
    auVar10._0_8_ =
         ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (ImVec2 *)0x1c45e8);
    auVar10._8_56_ = extraout_var_04;
    local_b0 = (ImVec2)vmovlpd_avx(auVar10._0_16_);
    ImRect::ImRect(&local_98,&local_a0,&local_b0);
    if (local_98.Max.x < local_98.Min.x) {
      ImSwap<float>((float *)&local_98,&local_98.Max.x);
    }
    if (local_98.Max.y < local_98.Min.y) {
      ImSwap<float>(&local_98.Min.y,&local_98.Max.y);
    }
    ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       in_stack_fffffffffffffdcc);
    ButtonBehavior((ImRect *)in_stack_fffffffffffffe28,
                   (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (bool *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (bool *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (ImGuiButtonFlags)in_stack_fffffffffffffe0c);
    if (((local_b9 & 1) != 0) || ((local_ba & 1) != 0)) {
      IVar3 = 6;
      if (((uint)local_6c & 1) != 0) {
        IVar3 = 5;
      }
      *(ImGuiMouseCursor *)((long)local_40 + 0x1e20) = IVar3;
    }
    if ((((local_ba & 1) == 0) || ((*(bool *)((long)local_40 + 0x425) & 1U) == 0)) ||
       (local_6c != 0.0)) {
      if ((local_ba & 1) != 0) {
        auVar12._0_8_ =
             ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (ImVec2 *)0x1c4776);
        auVar12._8_56_ = extraout_var_06;
        local_d4 = vmovlpd_avx(auVar12._0_16_);
        auVar13._0_8_ =
             ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0.0
                        );
        auVar13._8_56_ = extraout_var_07;
        local_e4 = vmovlpd_avx(auVar13._0_16_);
        auVar14._0_8_ =
             ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0.0
                        );
        auVar14._8_56_ = extraout_var_08;
        local_ec = vmovlpd_avx(auVar14._0_16_);
        auVar15._0_8_ =
             ImLerp(in_stack_fffffffffffffdd8,
                    (ImVec2 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                    (ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        auVar15._8_56_ = extraout_var_09;
        local_dc = vmovlpd_avx(auVar15._0_16_);
        auVar16._0_8_ =
             ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (ImVec2 *)0x1c480d);
        auVar16._8_56_ = extraout_var_10;
        local_cc = vmovlpd_avx(auVar16._0_16_);
        fVar4 = ((ImVec2 *)local_80._8_8_)->x;
        if ((fVar4 != 1.0) || (NAN(fVar4))) {
          in_stack_fffffffffffffe18 = -3.4028235e+38;
        }
        else {
          in_stack_fffffffffffffe18 = *local_38;
        }
        fVar4 = ((ImVec2 *)local_80._8_8_)->y;
        if ((fVar4 != 1.0) || (NAN(fVar4))) {
          in_stack_fffffffffffffe14 = -3.4028235e+38;
        }
        else {
          in_stack_fffffffffffffe14 = local_38[1];
        }
        in_stack_fffffffffffffe1c = in_stack_fffffffffffffe18;
        ImVec2::ImVec2(&local_f4,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
        fVar4 = ((ImVec2 *)local_80._8_8_)->x;
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          in_stack_fffffffffffffe0c = 3.4028235e+38;
        }
        else {
          in_stack_fffffffffffffe0c = local_38[2];
        }
        fVar4 = ((ImVec2 *)local_80._8_8_)->y;
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          in_stack_fffffffffffffe08 = 3.4028235e+38;
        }
        else {
          in_stack_fffffffffffffe08 = local_38[3];
        }
        in_stack_fffffffffffffe10 = in_stack_fffffffffffffe0c;
        ImVec2::ImVec2(&local_fc,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
        local_110 = local_fc;
        IVar1.y = in_stack_fffffffffffffdec;
        IVar1.x = in_stack_fffffffffffffde8;
        auVar17._0_8_ = ImClamp(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,IVar1);
        auVar17._8_56_ = extraout_var_11;
        local_104 = vmovlpd_avx(auVar17._0_16_);
        local_cc = local_104;
        CalcResizePosSizeFromAnyCorner
                  ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      }
    }
    else {
      auVar11._0_8_ =
           CalcWindowSizeAfterConstraint(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      auVar11._8_56_ = extraout_var_05;
      local_c4 = (ImVec2)vmovlpd_avx(auVar11._0_16_);
      local_45 = 1;
      local_68 = local_c4;
      ClearActiveID();
    }
    if (((local_6c == 0.0) || ((local_ba & 1) != 0)) || ((local_b9 & 1) != 0)) {
      if ((local_ba & 1) == 0) {
        in_stack_fffffffffffffe04 = 4.2039e-44;
        if ((local_b9 & 1) != 0) {
          in_stack_fffffffffffffe04 = 4.34403e-44;
        }
      }
      else {
        in_stack_fffffffffffffe04 = 4.48416e-44;
      }
      IVar2 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                          SUB84(in_stack_fffffffffffffde0,0));
      local_30[(int)local_6c] = IVar2;
    }
  }
  for (local_114 = 0; (int)local_114 < (int)local_4c; local_114 = local_114 + 1) {
    auVar28 = (undefined1  [56])0x0;
    auVar30 = (undefined1  [56])0x0;
    IVar31 = GetResizeBorderRect((ImGuiWindow *)
                                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                 (int)in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
                                 (float)((ulong)in_stack_fffffffffffffde0 >> 0x20));
    auVar29._0_8_ = IVar31.Max;
    auVar29._8_56_ = auVar30;
    auVar18._0_8_ = IVar31.Min;
    auVar18._8_56_ = auVar28;
    local_128 = vmovlpd_avx(auVar18._0_16_);
    local_120 = vmovlpd_avx(auVar29._0_16_);
    ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       in_stack_fffffffffffffdcc);
    ButtonBehavior((ImRect *)in_stack_fffffffffffffe28,
                   (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   (bool *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (bool *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (ImGuiButtonFlags)in_stack_fffffffffffffe0c);
    if ((((local_115 & 1) != 0) && (0.04 < *(float *)((long)local_40 + 0x1b28))) ||
       ((local_116 & 1) != 0)) {
      IVar3 = 3;
      if ((local_114 & 1) != 0) {
        IVar3 = 4;
      }
      *(ImGuiMouseCursor *)((long)local_40 + 0x1e20) = IVar3;
      if ((local_116 & 1) != 0) {
        *local_20 = local_114;
      }
    }
    if ((local_116 & 1) != 0) {
      local_130 = local_10->Pos;
      ImVec2::ImVec2(&local_138);
      if (local_114 == 0) {
        ImVec2::ImVec2(&local_140,0.0,0.0);
        local_138 = local_140;
        local_130.y = (*(float *)((long)local_40 + 300) - *(float *)((long)local_40 + 0x1b5c)) + 4.0
        ;
      }
      if (local_114 == 1) {
        ImVec2::ImVec2(&local_148,1.0,0.0);
        local_138 = local_148;
        local_130.x = (((ImVec2 *)((long)local_40 + 0x128))->x -
                      ((ImVec2 *)((long)local_40 + 7000))->x) + 4.0;
      }
      if (local_114 == 2) {
        ImVec2::ImVec2(&local_150,0.0,1.0);
        local_138 = local_150;
        local_130.y = (*(float *)((long)local_40 + 300) - *(float *)((long)local_40 + 0x1b5c)) + 4.0
        ;
      }
      if (local_114 == 3) {
        ImVec2::ImVec2(&local_158,0.0,0.0);
        local_138 = local_158;
        local_130.x = (((ImVec2 *)((long)local_40 + 0x128))->x -
                      ((ImVec2 *)((long)local_40 + 7000))->x) + 4.0;
      }
      if (local_114 == 1) {
        fVar4 = *local_38;
      }
      else {
        fVar4 = -3.4028235e+38;
      }
      if (local_114 == 2) {
        fVar32 = local_38[1];
      }
      else {
        fVar32 = -3.4028235e+38;
      }
      in_stack_fffffffffffffe00 = fVar4;
      ImVec2::ImVec2(&local_160,fVar4,fVar32);
      if (local_114 == 3) {
        in_stack_fffffffffffffdf0 = local_38[2];
      }
      else {
        in_stack_fffffffffffffdf0 = 3.4028235e+38;
      }
      if (local_114 == 0) {
        in_stack_fffffffffffffdec = local_38[3];
      }
      else {
        in_stack_fffffffffffffdec = 3.4028235e+38;
      }
      in_stack_fffffffffffffdf4 = in_stack_fffffffffffffdf0;
      ImVec2::ImVec2(&local_168,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
      local_178 = local_168;
      mx.y = in_stack_fffffffffffffdec;
      mx.x = in_stack_fffffffffffffde8;
      auVar19._0_8_ = ImClamp(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,mx);
      auVar19._8_56_ = extraout_var_12;
      local_170 = vmovlpd_avx(auVar19._0_16_);
      local_130 = (ImVec2)local_170;
      CalcResizePosSizeFromAnyCorner
                ((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (ImVec2 *)CONCAT44(fVar4,fVar32),
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    }
  }
  PopID();
  (local_10->DC).NavLayerCurrent = ImGuiNavLayer_Main;
  if ((*(ImGuiWindow **)((long)local_40 + 0x1dd0) != (ImGuiWindow *)0x0) &&
     ((*(ImGuiWindow **)((long)local_40 + 0x1dd0))->RootWindow == local_10)) {
    ImVec2::ImVec2(&local_180);
    if ((*(ImGuiInputSource *)((long)local_40 + 0x1cd4) == ImGuiInputSource_NavKeyboard) &&
       ((*(bool *)((long)local_40 + 0x141) & 1U) != 0)) {
      auVar20._0_8_ =
           GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_fffffffffffffe0c,
                               (ImGuiInputReadMode)in_stack_fffffffffffffe08,
                               in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
      auVar20._8_56_ = extraout_var_13;
      local_180 = (ImVec2)vmovlpd_avx(auVar20._0_16_);
    }
    if (*(ImGuiInputSource *)((long)local_40 + 0x1cd4) == ImGuiInputSource_NavGamepad) {
      auVar21._0_8_ =
           GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_fffffffffffffe0c,
                               (ImGuiInputReadMode)in_stack_fffffffffffffe08,
                               in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
      auVar21._8_56_ = extraout_var_14;
      local_180 = (ImVec2)vmovlpd_avx(auVar21._0_16_);
    }
    if ((local_180.x == 0.0) && (!NAN(local_180.x))) {
      if ((local_180.y == 0.0) && (!NAN(local_180.y))) goto LAB_001c5134;
    }
    fVar4 = *(float *)((long)local_40 + 0x18) * 600.0;
    fVar32 = ImMin<float>(((ImVec2 *)((long)local_40 + 0xc0))->x,*(float *)((long)local_40 + 0xc4));
    fVar32 = ImFloor(fVar4 * fVar32);
    lhs = &local_180;
    operator*=(lhs,fVar32);
    auVar22._0_8_ =
         ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (ImVec2 *)0x1c5057);
    auVar22._8_56_ = extraout_var_15;
    vmovlpd_avx(auVar22._0_16_);
    auVar23._0_8_ =
         ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (ImVec2 *)0x1c5079);
    auVar23._8_56_ = extraout_var_16;
    vmovlpd_avx(auVar23._0_16_);
    auVar24._0_8_ = ImMax(lhs,(ImVec2 *)CONCAT44(fVar4,in_stack_fffffffffffffdd0));
    auVar24._8_56_ = extraout_var_17;
    local_180 = (ImVec2)vmovlpd_avx(auVar24._0_16_);
    *(bool *)((long)local_40 + 0x1df0) = false;
    *(bool *)((long)local_40 + 0x1cf7) = true;
    IVar2 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                        SUB84(in_stack_fffffffffffffde0,0));
    *local_30 = IVar2;
    auVar25._0_8_ =
         ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (ImVec2 *)0x1c5104);
    auVar25._8_56_ = extraout_var_18;
    vmovlpd_avx(auVar25._0_16_);
    auVar26._0_8_ =
         CalcWindowSizeAfterConstraint(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    auVar26._8_56_ = extraout_var_19;
    local_68 = (ImVec2)vmovlpd_avx(auVar26._0_16_);
  }
LAB_001c5134:
  if ((local_68.x != 3.4028235e+38) || (NAN(local_68.x))) {
    local_10->SizeFull = local_68;
    MarkIniSettingsDirty(local_10);
  }
  if ((local_60.x != 3.4028235e+38) || (NAN(local_60.x))) {
    auVar27._0_8_ = ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
    ;
    auVar27._8_56_ = extraout_var_20;
    IVar1 = (ImVec2)vmovlpd_avx(auVar27._0_16_);
    local_10->Pos = IVar1;
    MarkIniSettingsDirty(local_10);
  }
  local_10->Size = local_10->SizeFull;
  return (bool)(local_45 & 1);
}

Assistant:

static bool ImGui::UpdateWindowManualResize(ImGuiWindow* window, const ImVec2& size_auto_fit, int* border_held, int resize_grip_count, ImU32 resize_grip_col[4], const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindowFlags flags = window->Flags;

    if ((flags & ImGuiWindowFlags_NoResize) || (flags & ImGuiWindowFlags_AlwaysAutoResize) || window->AutoFitFramesX > 0 || window->AutoFitFramesY > 0)
        return false;
    if (window->WasActive == false) // Early out to avoid running this code for e.g. an hidden implicit/fallback Debug window.
        return false;

    bool ret_auto_fit = false;
    const int resize_border_count = g.IO.ConfigWindowsResizeFromEdges ? 4 : 0;
    const float grip_draw_size = IM_FLOOR(ImMax(g.FontSize * 1.35f, window->WindowRounding + 1.0f + g.FontSize * 0.2f));
    const float grip_hover_inner_size = IM_FLOOR(grip_draw_size * 0.75f);
    const float grip_hover_outer_size = g.IO.ConfigWindowsResizeFromEdges ? WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS : 0.0f;

    ImVec2 pos_target(FLT_MAX, FLT_MAX);
    ImVec2 size_target(FLT_MAX, FLT_MAX);

    // Resize grips and borders are on layer 1
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;

    // Manual resize grips
    PushID("#RESIZE");
    for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
    {
        const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
        const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPosN);

        // Using the FlattenChilds button flag we make the resize button accessible even if we are hovering over a child window
        ImRect resize_rect(corner - grip.InnerDir * grip_hover_outer_size, corner + grip.InnerDir * grip_hover_inner_size);
        if (resize_rect.Min.x > resize_rect.Max.x) ImSwap(resize_rect.Min.x, resize_rect.Max.x);
        if (resize_rect.Min.y > resize_rect.Max.y) ImSwap(resize_rect.Min.y, resize_rect.Max.y);
        bool hovered, held;
        ButtonBehavior(resize_rect, window->GetID(resize_grip_n), &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_NoNavFocus);
        //GetForegroundDrawList(window)->AddRect(resize_rect.Min, resize_rect.Max, IM_COL32(255, 255, 0, 255));
        if (hovered || held)
            g.MouseCursor = (resize_grip_n & 1) ? ImGuiMouseCursor_ResizeNESW : ImGuiMouseCursor_ResizeNWSE;

        if (held && g.IO.MouseDoubleClicked[0] && resize_grip_n == 0)
        {
            // Manual auto-fit when double-clicking
            size_target = CalcWindowSizeAfterConstraint(window, size_auto_fit);
            ret_auto_fit = true;
            ClearActiveID();
        }
        else if (held)
        {
            // Resize from any of the four corners
            // We don't use an incremental MouseDelta but rather compute an absolute target size based on mouse position
            ImVec2 corner_target = g.IO.MousePos - g.ActiveIdClickOffset + ImLerp(grip.InnerDir * grip_hover_outer_size, grip.InnerDir * -grip_hover_inner_size, grip.CornerPosN); // Corner of the window corresponding to our corner grip
            ImVec2 clamp_min = ImVec2(grip.CornerPosN.x == 1.0f ? visibility_rect.Min.x : -FLT_MAX, grip.CornerPosN.y == 1.0f ? visibility_rect.Min.y : -FLT_MAX);
            ImVec2 clamp_max = ImVec2(grip.CornerPosN.x == 0.0f ? visibility_rect.Max.x : +FLT_MAX, grip.CornerPosN.y == 0.0f ? visibility_rect.Max.y : +FLT_MAX);
            corner_target = ImClamp(corner_target, clamp_min, clamp_max);
            CalcResizePosSizeFromAnyCorner(window, corner_target, grip.CornerPosN, &pos_target, &size_target);
        }
        if (resize_grip_n == 0 || held || hovered)
            resize_grip_col[resize_grip_n] = GetColorU32(held ? ImGuiCol_ResizeGripActive : hovered ? ImGuiCol_ResizeGripHovered : ImGuiCol_ResizeGrip);
    }
    for (int border_n = 0; border_n < resize_border_count; border_n++)
    {
        bool hovered, held;
        ImRect border_rect = GetResizeBorderRect(window, border_n, grip_hover_inner_size, WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS);
        ButtonBehavior(border_rect, window->GetID(border_n + 4), &hovered, &held, ImGuiButtonFlags_FlattenChildren);
        //GetForegroundDrawLists(window)->AddRect(border_rect.Min, border_rect.Max, IM_COL32(255, 255, 0, 255));
        if ((hovered && g.HoveredIdTimer > WINDOWS_RESIZE_FROM_EDGES_FEEDBACK_TIMER) || held)
        {
            g.MouseCursor = (border_n & 1) ? ImGuiMouseCursor_ResizeEW : ImGuiMouseCursor_ResizeNS;
            if (held)
                *border_held = border_n;
        }
        if (held)
        {
            ImVec2 border_target = window->Pos;
            ImVec2 border_posn;
            if (border_n == 0) { border_posn = ImVec2(0, 0); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Top
            if (border_n == 1) { border_posn = ImVec2(1, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Right
            if (border_n == 2) { border_posn = ImVec2(0, 1); border_target.y = (g.IO.MousePos.y - g.ActiveIdClickOffset.y + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Bottom
            if (border_n == 3) { border_posn = ImVec2(0, 0); border_target.x = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS); } // Left
            ImVec2 clamp_min = ImVec2(border_n == 1 ? visibility_rect.Min.x : -FLT_MAX, border_n == 2 ? visibility_rect.Min.y : -FLT_MAX);
            ImVec2 clamp_max = ImVec2(border_n == 3 ? visibility_rect.Max.x : +FLT_MAX, border_n == 0 ? visibility_rect.Max.y : +FLT_MAX);
            border_target = ImClamp(border_target, clamp_min, clamp_max);
            CalcResizePosSizeFromAnyCorner(window, border_target, border_posn, &pos_target, &size_target);
        }
    }
    PopID();

    // Restore nav layer
    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;

    // Navigation resize (keyboard/gamepad)
    if (g.NavWindowingTarget && g.NavWindowingTarget->RootWindow == window)
    {
        ImVec2 nav_resize_delta;
        if (g.NavInputSource == ImGuiInputSource_NavKeyboard && g.IO.KeyShift)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard, ImGuiInputReadMode_Down);
        if (g.NavInputSource == ImGuiInputSource_NavGamepad)
            nav_resize_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_Down);
        if (nav_resize_delta.x != 0.0f || nav_resize_delta.y != 0.0f)
        {
            const float NAV_RESIZE_SPEED = 600.0f;
            nav_resize_delta *= ImFloor(NAV_RESIZE_SPEED * g.IO.DeltaTime * ImMin(g.IO.DisplayFramebufferScale.x, g.IO.DisplayFramebufferScale.y));
            nav_resize_delta = ImMax(nav_resize_delta, visibility_rect.Min - window->Pos - window->Size);
            g.NavWindowingToggleLayer = false;
            g.NavDisableMouseHover = true;
            resize_grip_col[0] = GetColorU32(ImGuiCol_ResizeGripActive);
            // FIXME-NAV: Should store and accumulate into a separate size buffer to handle sizing constraints properly, right now a constraint will make us stuck.
            size_target = CalcWindowSizeAfterConstraint(window, window->SizeFull + nav_resize_delta);
        }
    }

    // Apply back modified position/size to window
    if (size_target.x != FLT_MAX)
    {
        window->SizeFull = size_target;
        MarkIniSettingsDirty(window);
    }
    if (pos_target.x != FLT_MAX)
    {
        window->Pos = ImFloor(pos_target);
        MarkIniSettingsDirty(window);
    }

    window->Size = window->SizeFull;
    return ret_auto_fit;
}